

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall Lodtalk::AST::MessageSendNode::~MessageSendNode(MessageSendNode *this)

{
  pointer ppNVar1;
  Node **arg;
  pointer ppNVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MessageSendNode_0016fee8;
  if (this->receiver != (Node *)0x0) {
    (*this->receiver->_vptr_Node[1])();
  }
  ppNVar1 = (this->arguments).
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar2 = (this->arguments).
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1; ppNVar2 = ppNVar2 + 1
      ) {
    if (*ppNVar2 != (Node *)0x0) {
      (*(*ppNVar2)->_vptr_Node[1])();
    }
  }
  std::
  _Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>::
  ~_Vector_base(&(this->chainedMessages).
                 super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
               );
  std::_Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~_Vector_base
            (&(this->arguments).
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>);
  std::__cxx11::string::~string((string *)&this->selector);
  return;
}

Assistant:

MessageSendNode::~MessageSendNode()
{
	delete receiver;
	for(auto &arg : arguments)
		delete arg;
}